

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

size_t PAL_wcslen(char16_t *string)

{
  undefined8 local_20;
  size_t nChar;
  char16_t *string_local;
  
  local_20 = (char16_t *)0x0;
  nChar = (size_t)string;
  if (string == (char16_t *)0x0) {
    string_local = (char16_t *)0x0;
  }
  else {
    while (*(short *)nChar != 0) {
      local_20 = (char16_t *)((long)local_20 + 1);
      nChar = nChar + 2;
    }
    string_local = local_20;
  }
  return (size_t)string_local;
}

Assistant:

__attribute__((no_instrument_function))
size_t
__cdecl
PAL_wcslen(
        const char16_t *string)
{
    size_t nChar = 0;

    // no logging here. PAL's internal output also uses this method

    if ( !string )
    {
        return 0;
    }

    while (*string++)
    {
        nChar++;
    }

    return nChar;
}